

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void linsolve(double *A,int N,double *b,int *ipiv,double *x)

{
  int iVar1;
  double *__ptr;
  double local_50;
  double sum;
  double *y;
  int l;
  int c1;
  int j;
  int i;
  double *x_local;
  int *ipiv_local;
  double *b_local;
  int N_local;
  double *A_local;
  
  __ptr = (double *)malloc((long)N << 3);
  for (c1 = 0; c1 < N; c1 = c1 + 1) {
    __ptr[c1] = 0.0;
    x[c1] = 0.0;
    if ((A[c1 * N + c1] == 0.0) && (!NAN(A[c1 * N + c1]))) {
      printf("Warning : The Matrix system does not have a unique solution");
    }
  }
  *__ptr = b[*ipiv];
  for (c1 = 1; c1 < N; c1 = c1 + 1) {
    local_50 = 0.0;
    for (l = 0; l < c1; l = l + 1) {
      local_50 = __ptr[l] * A[c1 * N + l] + local_50;
    }
    __ptr[c1] = b[ipiv[c1]] - local_50;
  }
  x[N + -1] = __ptr[N + -1] / A[N * N + -1];
  for (c1 = N + -2; -1 < c1; c1 = c1 + -1) {
    local_50 = 0.0;
    iVar1 = c1 * (N + 1);
    y._0_4_ = 0;
    l = c1;
    while (l = l + 1, l < N) {
      y._0_4_ = (int)y + 1;
      local_50 = A[iVar1 + (int)y] * x[l] + local_50;
    }
    x[c1] = (__ptr[c1] - local_50) / A[iVar1];
  }
  free(__ptr);
  return;
}

Assistant:

void linsolve(double *A,int N,double *b,int *ipiv,double *x) {
	int i,j,c1,l;
	double *y;
	double sum;
	
	y = (double*) malloc(sizeof(double) *N);
	/*
	 * Two step Solution L * U * x = b
	 * Let U*x = y
	 * Solve L * y = b for y (Forward Substitution
	 * Solve U * x = b for x (Back Substitution)
	 */ 
	for(i = 0; i < N;++i) {
		y[i] = 0.;
		x[i] = 0.;
		if ( A[i*N + i] == 0.) {
			printf("Warning : The Matrix system does not have a unique solution");
			//exit(1);
		}
		//printf("\n B %d",ipiv[i]);
	}
	
	// Forward Substitution
	
	y[0] = b[ipiv[0]];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * A[c1 + j];
		}
		y[i] = b[ipiv[i]] - sum;
	}
	
	// Back Substitution
	
	x[N - 1] = y[N - 1]/A[N * N - 1];
	
	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += A[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / A[c1];
	}
	
	free(y);
}